

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

void sptk::snack::xa_to_aca(float *a,float *b,float *c,int p)

{
  int iVar1;
  int i;
  int iVar2;
  float *pfVar3;
  float *ap;
  long lVar4;
  ulong uVar5;
  float fVar6;
  
  fVar6 = 1.0;
  for (lVar4 = 0; p != (int)lVar4; lVar4 = lVar4 + 1) {
    fVar6 = fVar6 + a[lVar4] * a[lVar4];
  }
  *c = fVar6;
  iVar1 = 0;
  if (0 < p) {
    iVar1 = p;
  }
  pfVar3 = a + 1;
  iVar2 = p + -1;
  for (uVar5 = 1; uVar5 != iVar1 + 1; uVar5 = uVar5 + 1) {
    fVar6 = a[uVar5 - 1];
    for (lVar4 = 0; iVar2 != (int)lVar4; lVar4 = lVar4 + 1) {
      fVar6 = fVar6 + a[lVar4] * pfVar3[lVar4];
    }
    *b = fVar6 + fVar6;
    b = b + 1;
    pfVar3 = pfVar3 + 1;
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void xa_to_aca(float *a, float *b, float *c, int p)
#endif
{
  register float  s, *ap, *a0;
  register int  i, j;

  for ( s=1., ap=a, i = p; i--; ap++ )
    s += *ap * *ap;

  *c = s;
  for ( i = 1; i <= p; i++){
    s = a[i-1];
    for (a0 = a, ap = a+i, j = p-i; j--; )
      s += (*a0++ * *ap++);
    *b++ = (float) (2. * s);
  }

}